

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_GetUsedDivs(Vec_Int_t *vDivs,Vec_Int_t *vUsed)

{
  int iVar1;
  Vec_Int_t *p;
  int i;
  
  p = Vec_IntAlloc(vUsed->nSize);
  for (i = 0; i < vUsed->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vUsed,i);
    iVar1 = Vec_IntEntry(vDivs,iVar1);
    Vec_IntPush(p,iVar1);
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_GetUsedDivs( Vec_Int_t * vDivs, Vec_Int_t * vUsed )
{
    int i, iObj;
    Vec_Int_t * vRes = Vec_IntAlloc( Vec_IntSize(vUsed) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_IntPush( vRes, iObj );
    return vRes;
}